

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char * compile(char *filename)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  ulong len;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    pcVar1 = cpp((FILE *)__stream);
    printf("%s",pcVar1);
    fclose(__stream);
    yyin = (FILE *)fopen(filename,"r");
    yyparse();
    return filename;
  }
  compile_cold_1();
  len = 1;
  pcVar1 = (char *)calloc((size_t)filename,1);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  smalloc_cold_1();
  sVar2 = strlen(filename);
  if (sVar2 < len) {
    len = sVar2;
  }
  pcVar1 = (char *)smalloc(len);
  pcVar1 = strncpy(pcVar1,filename,len);
  return pcVar1;
}

Assistant:

char* compile(char *filename) {
    FILE *file = fopen(filename, "r");
    if(!file) { fprintf(stderr, "Error: could not open file `%s`: %s\n", filename, strerror(errno)); exit(1); }

    char *preprocessed = cpp(file);

    printf("%s", preprocessed);

    fclose(file);
    file = fopen(filename, "r");
    yyin=file;
    yyparse();
    return filename; // Haven't finished processing
}